

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase125::run(TestCase125 *this)

{
  byte *pbVar1;
  PointerBuilder builder_00;
  PointerBuilder builder_01;
  PointerReader reader;
  PointerReader reader_00;
  Builder builder_02;
  Builder builder_03;
  Builder builder_04;
  Builder builder_05;
  Reader reader_01;
  Builder builder_06;
  Reader reader_02;
  Builder reader_03;
  Reader reader_04;
  PointerBuilder builder_07;
  size_type sVar2;
  int iVar3;
  ListElementCount LVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ListSchema LVar10;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  undefined8 uVar11;
  undefined8 uVar12;
  WirePointer *pWVar13;
  BuilderFor<capnp::DynamicList> list;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> list_1;
  undefined1 local_398;
  uint local_37c;
  Builder root;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  Fault f;
  ClientHook *pCStack_320;
  WirePointer *local_318;
  BitsPerElementN<23> BStack_30c;
  ListElementCount local_2ec;
  Own<capnp::ClientHook,_std::nullptr_t> local_2e8;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_2d8;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_2b0;
  Builder local_288;
  Builder local_260;
  Reader local_228;
  Builder local_1f0;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_1c0;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined1 local_160 [64];
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root,&builder.super_MessageBuilder);
  list_1.reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  list_1.reader.segment = &(root._builder.segment)->super_SegmentReader;
  list_1.reader.ptr = (byte *)root._builder.pointers;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)&local_190,
             (EVP_PKEY_CTX *)(schemas::s_a0a8f314b80b63fd + 0x48));
  builder_05.builder.segment = (SegmentBuilder *)uStack_188;
  builder_05.schema.super_Schema.raw = (Schema)(Schema)local_190;
  builder_05.builder.capTable = (CapTableBuilder *)local_180;
  builder_05.builder.data = (void *)uStack_178;
  builder_05.builder.pointers = (WirePointer *)local_170;
  builder_05.builder.dataSize = (undefined4)uStack_168;
  builder_05.builder.pointerCount = uStack_168._4_2_;
  builder_05.builder._38_2_ = uStack_168._6_2_;
  initDynamicTestMessage(builder_05);
  StructBuilder::asReader(&root._builder);
  bVar7 = list_1.reader.structPointerCount != 0;
  list.builder.segment = (SegmentBuilder *)0x0;
  if (bVar7) {
    list.builder.segment = (SegmentBuilder *)list_1.reader._24_8_;
  }
  iVar3 = 0x7fffffff;
  if (bVar7) {
    iVar3 = list_1.reader.nestingLimit;
  }
  uVar8 = 0;
  list.schema.elementType._4_4_ = 0;
  list.schema.elementType.field_4.scopeId._0_4_ = 0;
  list.schema.elementType.field_4.scopeId._4_4_ = 0;
  if (bVar7) {
    uVar8 = list_1.reader.segment._0_4_;
    list.schema.elementType._4_4_ = list_1.reader.segment._4_4_;
    list.schema.elementType.field_4.scopeId._0_4_ = list_1.reader.capTable._0_4_;
    list.schema.elementType.field_4.scopeId._4_4_ = list_1.reader.capTable._4_4_;
  }
  list.schema.elementType.baseType = (short)uVar8;
  list.schema.elementType.listDepth = (char)((uint)uVar8 >> 0x10);
  list.schema.elementType.isImplicitParam = (bool)(char)((uint)uVar8 >> 0x18);
  list.builder.capTable = (CapTableBuilder *)CONCAT44(list.builder.capTable._4_4_,iVar3);
  AnyPointer::Reader::getAs<capnproto_test::capnp::test::TestAllTypes>(&local_1c0,(Reader *)&list);
  reader_01._reader.capTable = local_1c0._reader.capTable;
  reader_01._reader.segment = local_1c0._reader.segment;
  reader_01._reader.data = local_1c0._reader.data;
  reader_01._reader.pointers = local_1c0._reader.pointers;
  reader_01._reader.dataSize = local_1c0._reader.dataSize;
  reader_01._reader.pointerCount = local_1c0._reader.pointerCount;
  reader_01._reader._38_2_ = local_1c0._reader._38_2_;
  reader_01._reader.nestingLimit = local_1c0._reader.nestingLimit;
  reader_01._reader._44_4_ = local_1c0._reader._44_4_;
  checkTestMessage(reader_01);
  StructBuilder::asReader(&root._builder);
  bVar7 = list_1.reader.structPointerCount != 0;
  list.builder.segment = (SegmentBuilder *)0x0;
  if (bVar7) {
    list.builder.segment = (SegmentBuilder *)list_1.reader._24_8_;
  }
  iVar3 = 0x7fffffff;
  if (bVar7) {
    iVar3 = list_1.reader.nestingLimit;
  }
  uVar8 = 0;
  list.schema.elementType._4_4_ = 0;
  list.schema.elementType.field_4.scopeId._0_4_ = 0;
  list.schema.elementType.field_4.scopeId._4_4_ = 0;
  if (bVar7) {
    uVar8 = list_1.reader.segment._0_4_;
    list.schema.elementType._4_4_ = list_1.reader.segment._4_4_;
    list.schema.elementType.field_4.scopeId._0_4_ = list_1.reader.capTable._0_4_;
    list.schema.elementType.field_4.scopeId._4_4_ = list_1.reader.capTable._4_4_;
  }
  list.schema.elementType.baseType = (short)uVar8;
  list.schema.elementType.listDepth = (char)((uint)uVar8 >> 0x10);
  list.schema.elementType.isImplicitParam = (bool)(char)((uint)uVar8 >> 0x18);
  list.builder.capTable = (CapTableBuilder *)CONCAT44(list.builder.capTable._4_4_,iVar3);
  reader.capTable = (CapTableReader *)list.schema.elementType.field_4.schema;
  reader.segment = (SegmentReader *)list.schema.elementType._0_8_;
  reader.pointer = (WirePointer *)list.builder.segment;
  reader._24_8_ = list.builder.capTable;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (&local_228,reader,(StructSchema)0x655118);
  reader_02.reader.segment = local_228.reader.segment;
  reader_02.schema.super_Schema.raw = local_228.schema.super_Schema.raw;
  reader_02.reader.capTable = local_228.reader.capTable;
  reader_02.reader.data = local_228.reader.data;
  reader_02.reader.pointers = local_228.reader.pointers;
  reader_02.reader.dataSize = local_228.reader.dataSize;
  reader_02.reader.pointerCount = local_228.reader.pointerCount;
  reader_02.reader._38_2_ = local_228.reader._38_2_;
  reader_02.reader.nestingLimit = local_228.reader.nestingLimit;
  reader_02.reader._44_4_ = local_228.reader._44_4_;
  checkDynamicTestMessage(reader_02);
  list_1.reader.ptr = (byte *)root._builder.pointers;
  builder_00.capTable = root._builder.capTable;
  builder_00.segment = root._builder.segment;
  builder_00.pointer = root._builder.pointers;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (&local_1f0,builder_00,(StructSchema)0x655118);
  builder_06.builder.segment = local_1f0.builder.segment;
  builder_06.schema.super_Schema.raw = local_1f0.schema.super_Schema.raw;
  builder_06.builder.capTable = local_1f0.builder.capTable;
  builder_06.builder.data = local_1f0.builder.data;
  builder_06.builder.pointers = local_1f0.builder.pointers;
  builder_06.builder.dataSize = local_1f0.builder.dataSize;
  builder_06.builder.pointerCount = local_1f0.builder.pointerCount;
  builder_06.builder._38_2_ = local_1f0.builder._38_2_;
  checkDynamicTestMessage(builder_06);
  list_1.reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  list_1.reader.segment = &(root._builder.segment)->super_SegmentReader;
  list_1.reader.ptr = (byte *)root._builder.pointers;
  ListSchema::FromImpl<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get();
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::init((EVP_PKEY_CTX *)&list);
  list_1.reader.segment._0_4_ = 3;
  list_1.reader.capTable = (CapTableReader *)0x7b;
  DynamicList::Builder::set(&list,0,(Reader *)&list_1);
  DynamicValue::Reader::~Reader((Reader *)&list_1);
  list_1.reader.segment._0_4_ = 3;
  list_1.reader.capTable = (CapTableReader *)0x1c8;
  DynamicList::Builder::set(&list,1,(Reader *)&list_1);
  DynamicValue::Reader::~Reader((Reader *)&list_1);
  list_1.reader.segment._0_4_ = 3;
  list_1.reader.capTable = (CapTableReader *)0x315;
  DynamicList::Builder::set(&list,2,(Reader *)&list_1);
  DynamicValue::Reader::~Reader((Reader *)&list_1);
  list_1.reader.segment._0_4_ = 3;
  list_1.reader.capTable = (CapTableReader *)0x75bcd15;
  DynamicList::Builder::set(&list,3,(Reader *)&list_1);
  DynamicValue::Reader::~Reader((Reader *)&list_1);
  StructBuilder::asReader(&root._builder);
  LVar4 = 0x7fffffff;
  if (list.builder.ptr._4_2_ != 0) {
    LVar4 = list.builder.elementCount;
  }
  uVar8._0_2_ = VOID;
  uVar8._2_1_ = '\0';
  uVar8._3_1_ = false;
  uVar9._0_2_ = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  uVar9._2_2_ = 0;
  if (list.builder.ptr._4_2_ != 0) {
    uVar8 = list.schema.elementType._0_4_;
    uVar9 = list.schema.elementType._4_4_;
  }
  f.exception._4_2_ = SUB42(uVar9,0);
  f.exception._6_2_ = SUB42(uVar9,2);
  f.exception._0_2_ = (Which)uVar8;
  f.exception._2_1_ = SUB41(uVar8,2);
  f.exception._3_1_ = SUB41(uVar8,3);
  AnyPointer::Reader::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&list_1,(Reader *)&f);
  list.schema.elementType._4_4_ = list_1.reader.elementCount;
  list.schema.elementType.baseType = INT32;
  list.schema.elementType.listDepth = '\0';
  list.schema.elementType.isImplicitParam = false;
  list.schema.elementType.field_4.schema = (RawBrandedSchema *)anon_var_dwarf_3d166;
  list.builder.segment = (SegmentBuilder *)&DAT_00000005;
  list.builder.capTable =
       (CapTableBuilder *)CONCAT71(list.builder.capTable._1_7_,list_1.reader.elementCount == 4);
  if (list_1.reader.elementCount == 4) {
    list.schema.elementType._4_4_ = *(undefined4 *)list_1.reader.ptr;
    list.schema.elementType.baseType = 0x7b;
    list.schema.elementType.listDepth = '\0';
    list.schema.elementType.isImplicitParam = false;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)anon_var_dwarf_3d166;
    list.builder.segment = (SegmentBuilder *)&DAT_00000005;
    list.builder.capTable =
         (CapTableBuilder *)
         CONCAT71(list.builder.capTable._1_7_,list.schema.elementType._4_4_ == 0x7b);
    if (kj::_::Debug::minSeverity < 3 && list.schema.elementType._4_4_ != 0x7b) {
      f.exception._0_4_ = 0x7b;
      orphan.builder.tag.content._0_4_ = *(undefined4 *)list_1.reader.ptr;
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x96,ERROR,
                 "\"failed: expected \" \"(123u) == (list[0])\", _kjCondition, 123u, list[0]",
                 (char (*) [37])"failed: expected (123u) == (list[0])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)&list,(uint *)&f,(uint *)&orphan);
    }
    list.schema.elementType._4_4_ = *(undefined4 *)(list_1.reader.ptr + (list_1.reader.step >> 3));
    list.schema.elementType.baseType = 0x1c8;
    list.schema.elementType.listDepth = '\0';
    list.schema.elementType.isImplicitParam = false;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)anon_var_dwarf_3d166;
    list.builder.segment = (SegmentBuilder *)&DAT_00000005;
    list.builder.capTable =
         (CapTableBuilder *)
         CONCAT71(list.builder.capTable._1_7_,list.schema.elementType._4_4_ == 0x1c8);
    if (kj::_::Debug::minSeverity < 3 && list.schema.elementType._4_4_ != 0x1c8) {
      f.exception._0_4_ = 0x1c8;
      orphan.builder.tag.content._0_4_ =
           *(undefined4 *)(list_1.reader.ptr + (list_1.reader.step >> 3));
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x97,ERROR,
                 "\"failed: expected \" \"(456u) == (list[1])\", _kjCondition, 456u, list[1]",
                 (char (*) [37])"failed: expected (456u) == (list[1])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)&list,(uint *)&f,(uint *)&orphan);
    }
    list.schema.elementType._4_4_ = *(undefined4 *)(list_1.reader.ptr + (list_1.reader.step >> 2));
    list.schema.elementType.baseType = 0x315;
    list.schema.elementType.listDepth = '\0';
    list.schema.elementType.isImplicitParam = false;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)anon_var_dwarf_3d166;
    list.builder.segment = (SegmentBuilder *)&DAT_00000005;
    list.builder.capTable =
         (CapTableBuilder *)
         CONCAT71(list.builder.capTable._1_7_,list.schema.elementType._4_4_ == 0x315);
    uVar5 = list_1.reader.step;
    if (kj::_::Debug::minSeverity < 3 && list.schema.elementType._4_4_ != 0x315) {
      f.exception._0_4_ = 0x315;
      orphan.builder.tag.content._0_4_ =
           *(undefined4 *)(list_1.reader.ptr + (list_1.reader.step >> 2));
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x98,ERROR,
                 "\"failed: expected \" \"(789u) == (list[2])\", _kjCondition, 789u, list[2]",
                 (char (*) [37])"failed: expected (789u) == (list[2])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)&list,(uint *)&f,(uint *)&orphan);
      uVar5 = list_1.reader.step;
    }
    uVar6 = (ulong)uVar5 * 3 >> 3;
    list.schema.elementType._4_4_ = *(undefined4 *)(list_1.reader.ptr + uVar6);
    list.schema.elementType.baseType = 0xcd15;
    list.schema.elementType.listDepth = '[';
    list.schema.elementType.isImplicitParam = true;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)anon_var_dwarf_3d166;
    list.builder.segment = (SegmentBuilder *)&DAT_00000005;
    list.builder.capTable =
         (CapTableBuilder *)
         CONCAT71(list.builder.capTable._1_7_,list.schema.elementType._4_4_ == 0x75bcd15);
    if ((list.schema.elementType._4_4_ != 0x75bcd15) && (kj::_::Debug::minSeverity < 3)) {
      f.exception._0_4_ = 0x75bcd15;
      orphan.builder.tag.content._0_4_ = *(undefined4 *)(list_1.reader.ptr + uVar6);
      kj::_::Debug::
      log<char_const(&)[43],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x99,ERROR,
                 "\"failed: expected \" \"(123456789u) == (list[3])\", _kjCondition, 123456789u, list[3]"
                 ,(char (*) [43])"failed: expected (123456789u) == (list[3])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)&list,(uint *)&f,(uint *)&orphan);
    }
    StructBuilder::asReader(&root._builder);
    bVar7 = list_1.reader.structPointerCount != 0;
    list.builder.segment = (SegmentBuilder *)0x0;
    if (bVar7) {
      list.builder.segment = (SegmentBuilder *)list_1.reader._24_8_;
    }
    iVar3 = 0x7fffffff;
    if (bVar7) {
      iVar3 = list_1.reader.nestingLimit;
    }
    uVar8 = 0;
    list.schema.elementType._4_4_ = 0;
    list.schema.elementType.field_4.scopeId._0_4_ = 0;
    list.schema.elementType.field_4.scopeId._4_4_ = 0;
    if (bVar7) {
      uVar8 = list_1.reader.segment._0_4_;
      list.schema.elementType._4_4_ = list_1.reader.segment._4_4_;
      list.schema.elementType.field_4.scopeId._0_4_ = list_1.reader.capTable._0_4_;
      list.schema.elementType.field_4.scopeId._4_4_ = list_1.reader.capTable._4_4_;
    }
    list.schema.elementType.baseType = (short)uVar8;
    list.schema.elementType.listDepth = (char)((uint)uVar8 >> 0x10);
    list.schema.elementType.isImplicitParam = (bool)(char)((uint)uVar8 >> 0x18);
    list.builder.capTable = (CapTableBuilder *)CONCAT44(list.builder.capTable._4_4_,iVar3);
    LVar10 = ListSchema::FromImpl<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get();
    sVar2 = LVar10.elementType._0_8_;
    reader_00.capTable = (CapTableReader *)list.schema.elementType.field_4.schema;
    reader_00.segment = (SegmentReader *)list.schema.elementType._0_8_;
    reader_00.pointer = (WirePointer *)list.builder.segment;
    reader_00._24_8_ = list.builder.capTable;
    PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
              ((Reader *)local_160,reader_00,LVar10);
    f.exception = (Exception *)0x1c80000007b;
    reader_04.schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)local_160._8_8_;
    reader_04.schema.elementType.baseType = local_160._0_2_;
    reader_04.schema.elementType.listDepth = local_160[2];
    reader_04.schema.elementType.isImplicitParam = (bool)local_160[3];
    reader_04.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_160._4_2_;
    reader_04.schema.elementType._6_2_ = local_160._6_2_;
    reader_04.reader.segment = (SegmentReader *)local_160._16_8_;
    reader_04.reader.capTable = (CapTableReader *)local_160._24_8_;
    reader_04.reader.ptr = (byte *)local_160._32_8_;
    reader_04.reader.elementCount = local_160._40_4_;
    reader_04.reader.step = local_160._44_4_;
    reader_04.reader.structDataSize = local_160._48_4_;
    reader_04.reader.structPointerCount = local_160._52_2_;
    reader_04.reader.elementSize = local_160[0x36];
    reader_04.reader._39_1_ = local_160[0x37];
    reader_04.reader._40_8_ = local_160._56_8_;
    expected._M_len = sVar2;
    expected._M_array = (iterator)&f;
    (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_04,expected);
    list_1.reader.capTable = &(root._builder.capTable)->super_CapTableReader;
    list_1.reader.segment = &(root._builder.segment)->super_SegmentReader;
    list_1.reader.ptr = (byte *)root._builder.pointers;
    LVar10 = ListSchema::FromImpl<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get();
    sVar2 = LVar10.elementType._0_8_;
    builder_01.pointer = (WirePointer *)list_1.reader.ptr;
    builder_01.segment = (SegmentBuilder *)list_1.reader.segment;
    builder_01.capTable = (CapTableBuilder *)list_1.reader.capTable;
    PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic(&local_260,builder_01,LVar10);
    list.schema.elementType.baseType = 0x7b;
    list.schema.elementType.listDepth = '\0';
    list.schema.elementType.isImplicitParam = false;
    list.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x1c8;
    list.schema.elementType._6_2_ = 0;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)0x75bcd1500000315;
    reader_03.schema.elementType.field_4.schema = local_260.schema.elementType.field_4.schema;
    reader_03.schema.elementType.baseType = local_260.schema.elementType.baseType;
    reader_03.schema.elementType.listDepth = local_260.schema.elementType.listDepth;
    reader_03.schema.elementType.isImplicitParam = local_260.schema.elementType.isImplicitParam;
    reader_03.schema.elementType.field_3 = local_260.schema.elementType.field_3;
    reader_03.schema.elementType._6_2_ = local_260.schema.elementType._6_2_;
    reader_03.builder.segment = local_260.builder.segment;
    reader_03.builder.capTable = local_260.builder.capTable;
    reader_03.builder.ptr = local_260.builder.ptr;
    reader_03.builder.elementCount = local_260.builder.elementCount;
    reader_03.builder.step = local_260.builder.step;
    reader_03.builder.structDataSize = local_260.builder.structDataSize;
    reader_03.builder.structPointerCount = local_260.builder.structPointerCount;
    reader_03.builder.elementSize = local_260.builder.elementSize;
    reader_03.builder._39_1_ = local_260.builder._39_1_;
    expected_00._M_len = sVar2;
    expected_00._M_array = (iterator)&list;
    (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Builder>
              (reader_03,expected_00);
    list.builder._24_8_ = root._builder._32_8_;
    list.builder.capTable = (CapTableBuilder *)root._builder.data;
    list.builder.ptr = (byte *)root._builder.pointers;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)root._builder.segment;
    list.builder.segment = (SegmentBuilder *)root._builder.capTable;
    list.schema.elementType.baseType = 0x5228;
    list.schema.elementType.listDepth = 'e';
    list.schema.elementType.isImplicitParam = false;
    list.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
    list.schema.elementType._6_2_ = 0;
    list_1.reader.segment._0_4_ = 6;
    list_1.reader.capTable = (CapTableReader *)"foo";
    list_1.reader.ptr = &DAT_00000004;
    name.content.size_ = 0x10;
    name.content.ptr = "anyPointerField";
    DynamicStruct::Builder::set((Builder *)&list,name,(Reader *)&list_1);
    DynamicValue::Reader::~Reader((Reader *)&list_1);
    orphan.builder.tag.content = (uint64_t)anon_var_dwarf_3ca9f;
    f.exception = (Exception *)root._builder.segment;
    pCStack_320 = (ClientHook *)root._builder.capTable;
    local_318 = root._builder.pointers;
    AnyPointer::Builder::getAs<capnp::Text>((BuilderFor<capnp::Text> *)&list,(Builder *)&f);
    kj::_::DebugExpression<char_const(&)[4]>::operator==
              ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&list_1,
               (DebugExpression<char_const(&)[4]> *)&orphan,(Builder *)&list);
    uVar11 = local_260.builder._24_8_;
    uVar12 = local_260.builder._32_8_;
    pWVar13 = (WirePointer *)local_160._56_8_;
    if ((local_398 == '\0') && (kj::_::Debug::minSeverity < 3)) {
      f.exception = (Exception *)root._builder.segment;
      pCStack_320 = (ClientHook *)root._builder.capTable;
      local_318 = root._builder.pointers;
      AnyPointer::Builder::getAs<capnp::Text>((BuilderFor<capnp::Text> *)&list,(Builder *)&f);
      kj::_::Debug::
      log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xa4,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (root.getAnyPointerField().getAs<Text>())\", _kjCondition, \"foo\", root.getAnyPointerField().getAs<Text>()"
                 ,(char (*) [70])
                  "failed: expected (\"foo\") == (root.getAnyPointerField().getAs<Text>())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&list_1,
                 (char (*) [4])"foo",(Builder *)&list);
      uVar11 = local_260.builder._24_8_;
      uVar12 = local_260.builder._32_8_;
      pWVar13 = (WirePointer *)local_160._56_8_;
    }
    list_1.reader._0_16_ = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
    Orphanage::newOrphan<capnproto_test::capnp::test::TestAllTypes>(&orphan,(Orphanage *)&list_1);
    OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::apply
              (&local_288,&orphan.builder);
    builder_02._builder.capTable = local_288._builder.capTable;
    builder_02._builder.segment = local_288._builder.segment;
    builder_02._builder.data = local_288._builder.data;
    builder_02._builder.pointers = local_288._builder.pointers;
    builder_02._builder.dataSize = local_288._builder.dataSize;
    builder_02._builder.pointerCount = local_288._builder.pointerCount;
    builder_02._builder._38_2_ = local_288._builder._38_2_;
    initTestMessage(builder_02);
    list.builder._24_8_ = root._builder._32_8_;
    list.builder.capTable = (CapTableBuilder *)root._builder.data;
    list.builder.ptr = (byte *)root._builder.pointers;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)root._builder.segment;
    list.builder.segment = (SegmentBuilder *)root._builder.capTable;
    list.schema.elementType.baseType = 0x5228;
    list.schema.elementType.listDepth = 'e';
    list.schema.elementType.isImplicitParam = false;
    list.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
    list.schema.elementType._6_2_ = 0;
    OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::applyReader
              ((Reader *)&f,&orphan.builder);
    list_1.reader._44_4_ = BStack_30c;
    list_1.reader.nestingLimit = LVar4;
    list_1.reader._32_8_ = local_318;
    list_1.reader.ptr = (byte *)f.exception;
    list_1.reader._24_8_ = pCStack_320;
    list_1.reader.segment._0_4_ = 10;
    list_1.reader.capTable = (CapTableReader *)(schemas::s_a0a8f314b80b63fd + 0x48);
    name_00.content.size_ = 0x10;
    name_00.content.ptr = "anyPointerField";
    DynamicStruct::Builder::set((Builder *)&list,name_00,(Reader *)&list_1);
    DynamicValue::Reader::~Reader((Reader *)&list_1);
    list_1.reader.ptr = (byte *)root._builder.pointers;
    AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
              (&local_2b0,(Builder *)&list_1);
    builder_03._builder.capTable = local_2b0._builder.capTable;
    builder_03._builder.segment = local_2b0._builder.segment;
    builder_03._builder.data = local_2b0._builder.data;
    builder_03._builder.pointers = local_2b0._builder.pointers;
    builder_03._builder.dataSize = local_2b0._builder.dataSize;
    builder_03._builder.pointerCount = local_2b0._builder.pointerCount;
    builder_03._builder._38_2_ = local_2b0._builder._38_2_;
    checkTestMessage(builder_03);
    list.builder._24_8_ = root._builder._32_8_;
    list.builder.capTable = (CapTableBuilder *)root._builder.data;
    list.builder.ptr = (byte *)root._builder.pointers;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)root._builder.segment;
    list.builder.segment = (SegmentBuilder *)root._builder.capTable;
    list.schema.elementType.baseType = 0x5228;
    list.schema.elementType.listDepth = 'e';
    list.schema.elementType.isImplicitParam = false;
    list.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
    list.schema.elementType._6_2_ = 0;
    Orphan<capnp::DynamicValue>::Orphan<capnproto_test::capnp::test::TestAllTypes>
              ((Orphan<capnp::DynamicValue> *)&list_1,&orphan);
    name_01.content.size_ = 0x10;
    name_01.content.ptr = "anyPointerField";
    DynamicStruct::Builder::adopt((Builder *)&list,name_01,(Orphan<capnp::DynamicValue> *)&list_1);
    OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&list_1.reader.elementCount);
    list_1.reader.ptr = (byte *)root._builder.pointers;
    AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
              (&local_2d8,(Builder *)&list_1);
    builder_04._builder.capTable = local_2d8._builder.capTable;
    builder_04._builder.segment = local_2d8._builder.segment;
    builder_04._builder.data = local_2d8._builder.data;
    builder_04._builder.pointers = local_2d8._builder.pointers;
    builder_04._builder.dataSize = local_2d8._builder.dataSize;
    builder_04._builder.pointerCount = local_2d8._builder.pointerCount;
    builder_04._builder._38_2_ = local_2d8._builder._38_2_;
    checkTestMessage(builder_04);
    OrphanBuilder::~OrphanBuilder(&orphan.builder);
    list_1.reader._0_16_ = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
    Orphanage::newOrphan<capnp::List<unsigned_int,(capnp::Kind)0>>
              ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&orphan,(Orphanage *)&list_1,3)
    ;
    OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::apply
              ((Builder *)&list_1,&orphan.builder);
    list_1.reader.ptr[0] = '\f';
    list_1.reader.ptr[1] = '\0';
    list_1.reader.ptr[2] = '\0';
    list_1.reader.ptr[3] = '\0';
    OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::apply
              ((Builder *)&list_1,&orphan.builder);
    pbVar1 = list_1.reader.ptr + ((ulong)list_1.reader._24_8_ >> 0x23);
    pbVar1[0] = '\"';
    pbVar1[1] = '\0';
    pbVar1[2] = '\0';
    pbVar1[3] = '\0';
    OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::apply
              ((Builder *)&list_1,&orphan.builder);
    pbVar1 = list_1.reader.ptr + ((ulong)list_1.reader._24_8_ >> 0x22);
    pbVar1[0] = '8';
    pbVar1[1] = '\0';
    pbVar1[2] = '\0';
    pbVar1[3] = '\0';
    list.builder._24_8_ = root._builder._32_8_;
    list.builder.capTable = (CapTableBuilder *)root._builder.data;
    list.builder.ptr = (byte *)root._builder.pointers;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)root._builder.segment;
    list.builder.segment = (SegmentBuilder *)root._builder.capTable;
    list.schema.elementType.baseType = 0x5228;
    list.schema.elementType.listDepth = 'e';
    list.schema.elementType.isImplicitParam = false;
    list.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
    list.schema.elementType._6_2_ = 0;
    OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::applyReader
              ((Reader *)&f,&orphan.builder);
    DynamicValue::Reader::
    Reader<capnp::List<unsigned_int,(capnp::Kind)0>::Reader,capnp::DynamicList::Reader>
              ((Reader *)&list_1,(Reader *)&f);
    name_02.content.size_ = 0x10;
    name_02.content.ptr = "anyPointerField";
    DynamicStruct::Builder::set((Builder *)&list,name_02,(Reader *)&list_1);
    DynamicValue::Reader::~Reader((Reader *)&list_1);
    list.schema.elementType._0_8_ = root._builder.segment;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)root._builder.capTable;
    list.builder.segment = (SegmentBuilder *)root._builder.pointers;
    AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>
              ((BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&list_1,(Builder *)&list);
    list.schema.elementType._4_4_ = list_1.reader.elementCount;
    list.schema.elementType.baseType = INT16;
    list.schema.elementType.listDepth = '\0';
    list.schema.elementType.isImplicitParam = false;
    list.schema.elementType.field_4.schema = (RawBrandedSchema *)anon_var_dwarf_3d166;
    list.builder.segment = (SegmentBuilder *)&DAT_00000005;
    list.builder.capTable =
         (CapTableBuilder *)CONCAT71(list.builder.capTable._1_7_,list_1.reader.elementCount == 3);
    if (list_1.reader.elementCount == 3) {
      list.schema.elementType._4_4_ = *(undefined4 *)list_1.reader.ptr;
      list.schema.elementType.baseType = TEXT;
      list.schema.elementType.listDepth = '\0';
      list.schema.elementType.isImplicitParam = false;
      list.schema.elementType.field_4.schema = (RawBrandedSchema *)anon_var_dwarf_3d166;
      list.builder.segment = (SegmentBuilder *)&DAT_00000005;
      list.builder.capTable =
           (CapTableBuilder *)
           CONCAT71(list.builder.capTable._1_7_,list.schema.elementType._4_4_ == 0xc);
      if (kj::_::Debug::minSeverity < 3 && list.schema.elementType._4_4_ != 0xc) {
        f.exception._0_4_ = 0xc;
        local_37c = *(uint *)list_1.reader.ptr;
        kj::_::Debug::
        log<char_const(&)[32],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0xb8,ERROR,"\"failed: expected \" \"(12) == (l[0])\", _kjCondition, 12, l[0]",
                   (char (*) [32])"failed: expected (12) == (l[0])",
                   (DebugComparison<int,_unsigned_int> *)&list,(int *)&f,&local_37c);
      }
      list.schema.elementType._4_4_ = *(undefined4 *)(list_1.reader.ptr + (list_1.reader.step >> 3))
      ;
      list.schema.elementType.baseType = 0x22;
      list.schema.elementType.listDepth = '\0';
      list.schema.elementType.isImplicitParam = false;
      list.schema.elementType.field_4.schema = (RawBrandedSchema *)anon_var_dwarf_3d166;
      list.builder.segment = (SegmentBuilder *)&DAT_00000005;
      list.builder.capTable =
           (CapTableBuilder *)
           CONCAT71(list.builder.capTable._1_7_,list.schema.elementType._4_4_ == 0x22);
      if (kj::_::Debug::minSeverity < 3 && list.schema.elementType._4_4_ != 0x22) {
        f.exception._0_4_ = 0x22;
        local_37c = list.schema.elementType._4_4_;
        kj::_::Debug::
        log<char_const(&)[32],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0xb9,ERROR,"\"failed: expected \" \"(34) == (l[1])\", _kjCondition, 34, l[1]",
                   (char (*) [32])"failed: expected (34) == (l[1])",
                   (DebugComparison<int,_unsigned_int> *)&list,(int *)&f,&local_37c);
      }
      list.schema.elementType._4_4_ = *(undefined4 *)(list_1.reader.ptr + (list_1.reader.step >> 2))
      ;
      list.schema.elementType.baseType = 0x38;
      list.schema.elementType.listDepth = '\0';
      list.schema.elementType.isImplicitParam = false;
      list.schema.elementType.field_4.schema = (RawBrandedSchema *)anon_var_dwarf_3d166;
      list.builder.segment = (SegmentBuilder *)&DAT_00000005;
      list.builder.capTable =
           (CapTableBuilder *)
           CONCAT71(list.builder.capTable._1_7_,list.schema.elementType._4_4_ == 0x38);
      if ((list.schema.elementType._4_4_ != 0x38) && (kj::_::Debug::minSeverity < 3)) {
        f.exception._0_4_ = 0x38;
        local_37c = *(uint *)(list_1.reader.ptr + (list_1.reader.step >> 2));
        kj::_::Debug::
        log<char_const(&)[32],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0xba,ERROR,"\"failed: expected \" \"(56) == (l[2])\", _kjCondition, 56, l[2]",
                   (char (*) [32])"failed: expected (56) == (l[2])",
                   (DebugComparison<int,_unsigned_int> *)&list,(int *)&f,&local_37c);
      }
      OrphanBuilder::~OrphanBuilder(&orphan.builder);
      list.builder._24_8_ = root._builder._32_8_;
      list.builder.capTable = (CapTableBuilder *)root._builder.data;
      list.builder.ptr = (byte *)root._builder.pointers;
      list.schema.elementType.field_4.schema = (RawBrandedSchema *)root._builder.segment;
      list.builder.segment = (SegmentBuilder *)root._builder.capTable;
      list.schema.elementType.baseType = 0x5228;
      list.schema.elementType.listDepth = 'e';
      list.schema.elementType.isImplicitParam = false;
      list.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
      list.schema.elementType._6_2_ = 0;
      Capability::Client::Client((Client *)&f,(void *)0x0);
      DynamicValue::Reader::Reader<capnp::Capability::Client,capnp::DynamicCapability::Client>
                ((Reader *)&list_1,(Client *)&f);
      name_03.content.size_ = 0x10;
      name_03.content.ptr = "anyPointerField";
      DynamicStruct::Builder::set((Builder *)&list,name_03,(Reader *)&list_1);
      DynamicValue::Reader::~Reader((Reader *)&list_1);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                ((Own<capnp::ClientHook,_std::nullptr_t> *)&f);
      list_1.reader.ptr = (byte *)root._builder.pointers;
      builder_07.capTable = (CapTableBuilder *)uVar12;
      builder_07.segment = (SegmentBuilder *)uVar11;
      builder_07.pointer = pWVar13;
      PointerHelpers<capnp::Capability,_(capnp::Kind)5>::get(builder_07);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_2e8);
      MallocMessageBuilder::~MallocMessageBuilder(&builder);
      return;
    }
    local_37c = 3;
    local_2ec = list_1.reader.elementCount;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xb7,FAILED,"(3) == (l.size())","_kjCondition,3, l.size()",
               (DebugComparison<int,_unsigned_int> *)&list,(int *)&local_37c,&local_2ec);
    kj::_::Debug::Fault::fatal(&f);
  }
  orphan.builder.tag.content._0_4_ = 4;
  local_37c = list_1.reader.elementCount;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0x95,FAILED,"(4u) == (list.size())","_kjCondition,4u, list.size()",
             (DebugComparison<unsigned_int,_unsigned_int> *)&list,(uint *)&orphan,&local_37c);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(DynamicApi, AnyPointers) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initDynamicTestMessage(
      root.getAnyPointerField().initAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  checkDynamicTestMessage(
      root.asReader().getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));

  {
    {
      auto list = root.getAnyPointerField().initAs<DynamicList>(Schema::from<List<uint32_t>>(), 4);
      list.set(0, 123);
      list.set(1, 456);
      list.set(2, 789);
      list.set(3, 123456789);
    }

    {
      auto list = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(4u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
      EXPECT_EQ(123456789u, list[3]);
    }

    checkList<uint32_t>(root.asReader().getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(root.getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
  }

  // Setting an AnyPointer to various types should work.
  toDynamic(root).set("anyPointerField", capnp::Text::Reader("foo"));
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<Text>());

  {
    auto orphan = builder.getOrphanage().newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    toDynamic(root).set("anyPointerField", orphan.getReader());
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());

    toDynamic(root).adopt("anyPointerField", kj::mv(orphan));
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  }

  {
    auto lorphan = builder.getOrphanage().newOrphan<List<uint32_t>>(3);
    lorphan.get().set(0, 12);
    lorphan.get().set(1, 34);
    lorphan.get().set(2, 56);
    toDynamic(root).set("anyPointerField", lorphan.getReader());
    auto l = root.getAnyPointerField().getAs<List<uint32_t>>();
    ASSERT_EQ(3, l.size());
    EXPECT_EQ(12, l[0]);
    EXPECT_EQ(34, l[1]);
    EXPECT_EQ(56, l[2]);
  }

  // Just compile this one.
  toDynamic(root).set("anyPointerField", Capability::Client(nullptr));
  root.getAnyPointerField().getAs<Capability>();
}